

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O0

Action __thiscall
psy::C::DeclarationBinder::visitStructOrUnionDeclaration_AtSpecifier
          (DeclarationBinder *this,StructOrUnionDeclarationSyntax *node)

{
  Action AVar1;
  SyntaxKind SVar2;
  Identifier *pIVar3;
  TagType *pTVar4;
  ostream *poVar5;
  SyntaxToken local_b8;
  TagType *local_80;
  TagType *tagTy_1;
  SyntaxToken local_68;
  TagType *local_30;
  TagType *tagTy;
  TagTypeSpecifierSyntax *tySpec;
  StructOrUnionDeclarationSyntax *node_local;
  DeclarationBinder *this_local;
  
  tySpec = (TagTypeSpecifierSyntax *)node;
  node_local = (StructOrUnionDeclarationSyntax *)this;
  tagTy = (TagType *)TagDeclarationSyntax::typeSpecifier(&node->super_TagDeclarationSyntax);
  SVar2 = C::SyntaxNode::kind((SyntaxNode *)tagTy);
  if (SVar2 == StructTypeSpecifier) {
    TagTypeSpecifierSyntax::tagToken(&local_68,(TagTypeSpecifierSyntax *)tagTy);
    pIVar3 = obtainTag(this,&local_68);
    pTVar4 = makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                       (this,Struct,pIVar3);
    SyntaxToken::~SyntaxToken(&local_68);
    local_30 = pTVar4;
    bindDeclaration<psy::C::StructDeclarationSymbol,psy::C::TagType*>
              (this,(SyntaxNode *)tySpec,pTVar4);
  }
  else {
    if (SVar2 != UnionTypeSpecifier) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x46);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,"<empty message>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      return Quit;
    }
    TagTypeSpecifierSyntax::tagToken(&local_b8,(TagTypeSpecifierSyntax *)tagTy);
    pIVar3 = obtainTag(this,&local_b8);
    pTVar4 = makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                       (this,Union,pIVar3);
    SyntaxToken::~SyntaxToken(&local_b8);
    local_80 = pTVar4;
    bindDeclaration<psy::C::UnionDeclarationSymbol,psy::C::TagType*>
              (this,(SyntaxNode *)tySpec,pTVar4);
  }
  AVar1 = visitTagDeclaration_AtMemberDeclarations<psy::C::StructOrUnionDeclarationSyntax>
                    (this,(StructOrUnionDeclarationSyntax *)tySpec,0x454e70);
  return AVar1;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitStructOrUnionDeclaration_AtSpecifier(
        const StructOrUnionDeclarationSyntax* node)
{
    const TagTypeSpecifierSyntax* tySpec = node->typeSpecifier();
    switch (tySpec->kind()) {
        case SyntaxKind::StructTypeSpecifier: {
            auto tagTy = makeType<TagType>(
                        TagTypeKind::Struct,
                        obtainTag(tySpec->tagToken()));
            bindDeclaration<StructDeclarationSymbol>(node, tagTy);
            break;
        }
        case SyntaxKind::UnionTypeSpecifier:{
            auto tagTy = makeType<TagType>(
                        TagTypeKind::Union,
                        obtainTag(tySpec->tagToken()));
            bindDeclaration<UnionDeclarationSymbol>(node, tagTy);
            break;
        }
        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }

    return visitTagDeclaration_AtMemberDeclarations(
                node,
                &DeclarationBinder::visitStructOrUnionDeclaration_AtEnd);
}